

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

int __thiscall
Catch::Detail::anon_unknown_3::
StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>::overflow
          (StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL> *this,int c
          )

{
  int iVar1;
  size_type __n;
  size_type sVar2;
  int in_ESI;
  StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL> *in_RDI;
  string *in_stack_ffffffffffffff88;
  OutputDebugWriter *this_00;
  undefined4 in_stack_ffffffffffffff98;
  char __c;
  allocator<char> local_31;
  string local_30 [36];
  int local_c;
  
  local_c = in_ESI;
  sync(in_RDI);
  if (local_c != -1) {
    __n = std::streambuf::pbase();
    sVar2 = std::streambuf::epptr();
    if (__n == sVar2) {
      this_00 = (OutputDebugWriter *)&in_RDI->field_0x140;
      iVar1 = (int)(char)local_c;
      __c = (char)((ulong)&local_31 >> 0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__n,__c
                 ,(allocator<char> *)CONCAT44(iVar1,in_stack_ffffffffffffff98));
      OutputDebugWriter::operator()(this_00,in_stack_ffffffffffffff88);
      std::__cxx11::string::~string(local_30);
      std::allocator<char>::~allocator(&local_31);
    }
    else {
      std::streambuf::sputc((char)in_RDI);
    }
  }
  return 0;
}

Assistant:

int overflow( int c ) override {
                sync();

                if( c != EOF ) {
                    if( pbase() == epptr() )
                        m_writer( std::string( 1, static_cast<char>( c ) ) );
                    else
                        sputc( static_cast<char>( c ) );
                }
                return 0;
            }